

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGridPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  size_t sVar11;
  size_t sVar12;
  GridMeshNode *this_00;
  Vec3fa *pVVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  Ref<embree::SceneGraph::MaterialNode> local_68;
  ulong local_60;
  Node *local_58;
  size_t local_50;
  Vec3fa *local_48;
  Grid local_3c;
  
  local_58 = (Node *)this;
  local_50 = width;
  this_00 = (GridMeshNode *)::operator_new(0xa8);
  local_68.ptr = (MaterialNode *)((material.ptr)->super_Node).super_RefCount._vptr_RefCount;
  if (local_68.ptr != (MaterialNode *)0x0) {
    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  GridMeshNode::GridMeshNode(this_00,&local_68,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  sVar11 = local_50;
  if (local_68.ptr != (MaterialNode *)0x0) {
    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60 = height + 1;
  uVar18 = local_60 * (sVar11 + 1);
  uVar15 = pvVar3->size_alloced;
  uVar17 = uVar15;
  if ((uVar15 < uVar18) && (uVar19 = uVar15, uVar17 = uVar18, uVar15 != 0)) {
    for (; uVar17 = uVar19, uVar19 < uVar18; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
    }
  }
  if (uVar18 < pvVar3->size_active) {
    pvVar3->size_active = uVar18;
  }
  if (uVar15 == uVar17) {
    pvVar3->size_active = uVar18;
  }
  else {
    local_48 = pvVar3->items;
    pVVar13 = (Vec3fa *)alignedMalloc(uVar17 << 4,0x10);
    pvVar3->items = pVVar13;
    lVar14 = 0;
    for (uVar15 = 0; uVar15 < pvVar3->size_active; uVar15 = uVar15 + 1) {
      puVar1 = (undefined8 *)((long)&local_48->field_0 + lVar14);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      lVar14 = lVar14 + 0x10;
    }
    alignedFree(local_48);
    pvVar3->size_active = uVar18;
    pvVar3->size_alloced = uVar17;
  }
  sVar12 = local_50;
  local_3c.lineStride = (int)local_50 + 1;
  local_3c.startVtx = 0;
  local_3c.resY = (short)height + 1;
  local_3c.resX = (unsigned_short)local_3c.lineStride;
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::emplace_back<embree::SceneGraph::GridMeshNode::Grid>(&this_00->grids,&local_3c);
  lVar14 = 0;
  for (uVar15 = 0; uVar15 != local_60; uVar15 = uVar15 + 1) {
    fVar20 = (float)uVar15 / (float)height;
    lVar16 = lVar14;
    for (uVar17 = 0; sVar11 + 1 != uVar17; uVar17 = uVar17 + 1) {
      fVar21 = (float)uVar17 / (float)sVar12;
      fVar4 = (dx->field_0).m128[1];
      fVar5 = (dx->field_0).m128[2];
      fVar6 = (p0->field_0).m128[1];
      fVar7 = (p0->field_0).m128[2];
      fVar8 = (dy->field_0).m128[1];
      fVar9 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16) =
           (dy->field_0).m128[0] * fVar20 + fVar21 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 4) =
           fVar8 * fVar20 + fVar21 * fVar4 + fVar6;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 8) =
           fVar9 * fVar20 + fVar21 * fVar5 + fVar7;
      lVar16 = lVar16 + 0x10;
    }
    lVar14 = lVar14 + sVar12 * 0x10 + 0x10;
  }
  (local_58->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_58;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(0,(unsigned)width+1,(unsigned)width+1,(unsigned)height+1));

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }